

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_fetch_tag(yaml_parser_t *parser)

{
  void *__dest;
  int iVar1;
  undefined1 local_68 [8];
  yaml_token_t token;
  yaml_parser_t *parser_local;
  
  token.end_mark.column = (size_t)parser;
  iVar1 = yaml_parser_save_simple_key(parser);
  if (iVar1 == 0) {
    parser_local._4_4_ = 0;
  }
  else {
    *(undefined4 *)(token.end_mark.column + 0x154) = 0;
    iVar1 = yaml_parser_scan_tag((yaml_parser_t *)token.end_mark.column,(yaml_token_t *)local_68);
    if (iVar1 == 0) {
      parser_local._4_4_ = 0;
    }
    else if ((*(long *)(token.end_mark.column + 0x120) == *(long *)(token.end_mark.column + 0x110))
            && (iVar1 = yaml_queue_extend((void **)(token.end_mark.column + 0x108),
                                          (void **)(token.end_mark.column + 0x118),
                                          (void **)(token.end_mark.column + 0x120),
                                          (void **)(token.end_mark.column + 0x110)), iVar1 == 0)) {
      *(undefined4 *)token.end_mark.column = 1;
      yaml_token_delete((yaml_token_t *)local_68);
      parser_local._4_4_ = 0;
    }
    else {
      __dest = *(void **)(token.end_mark.column + 0x120);
      *(long *)(token.end_mark.column + 0x120) = (long)__dest + 0x50;
      memcpy(__dest,local_68,0x50);
      parser_local._4_4_ = 1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_fetch_tag(yaml_parser_t *parser)
{
    yaml_token_t token;

    /* A tag could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow a tag. */

    parser->simple_key_allowed = 0;

    /* Create the TAG token and append it to the queue. */

    if (!yaml_parser_scan_tag(parser, &token))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}